

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLCommonTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLCommonTest_setTextTest_Test::OpenDDLCommonTest_setTextTest_Test
          (OpenDDLCommonTest_setTextTest_Test *this)

{
  OpenDDLCommonTest_setTextTest_Test *this_local;
  
  OpenDDLCommonTest::OpenDDLCommonTest(&this->super_OpenDDLCommonTest);
  (this->super_OpenDDLCommonTest).super_Test._vptr_Test =
       (_func_int **)&PTR__OpenDDLCommonTest_setTextTest_Test_001e1760;
  return;
}

Assistant:

TEST_F(OpenDDLCommonTest, setTextTest) {
    Text *theText = createTestText();
    ASSERT_FALSE(nullptr == theText);

    static const std::string test2 = "Hello, World!";
    theText->set(test2.c_str(), test2.size());

    EXPECT_EQ(test2.size(), theText->m_len);
    const int res(strncmp(test2.c_str(), theText->m_buffer, test2.size()));
    EXPECT_EQ(0, res);
}